

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O3

int IDAAdjInit(void *ida_mem,long steps,int interp)

{
  void *__ptr;
  void *__ptr_00;
  void *pvVar1;
  code *pcVar2;
  code *pcVar3;
  int line;
  code *pcVar4;
  long lVar5;
  int error_code;
  code *pcVar6;
  char *msgfmt;
  int iVar7;
  long lVar8;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar7 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x70;
  }
  else if (steps < 1) {
    msgfmt = "Steps nonpositive illegal.";
    iVar7 = -0x16;
    error_code = -0x16;
    line = 0x7a;
  }
  else if (interp - 3U < 0xfffffffe) {
    msgfmt = "Illegal value for interp.";
    iVar7 = -0x16;
    error_code = -0x16;
    line = 0x82;
  }
  else {
    __ptr = malloc(0x178);
    if (__ptr == (void *)0x0) {
      msgfmt = "A memory request failed.";
      iVar7 = -0x15;
      error_code = -0x15;
      line = 0x8c;
    }
    else {
      *(void **)((long)ida_mem + 0x840) = __ptr;
      *(undefined8 *)((long)__ptr + 0x50) = 0;
      *(undefined8 *)((long)__ptr + 0x58) = 0;
      *(undefined4 *)((long)__ptr + 0x60) = 0;
      *(int *)((long)__ptr + 0x88) = interp;
      *(long *)((long)__ptr + 0x68) = steps;
      *(undefined8 *)((long)__ptr + 0x70) = 0xffffffffffffffff;
      *(undefined8 *)((long)__ptr + 0x78) = 0;
      __ptr_00 = malloc(steps * 8 + 8);
      if (__ptr_00 != (void *)0x0) {
        lVar5 = 0;
LAB_001180b9:
        pvVar1 = malloc(0x10);
        *(void **)((long)__ptr_00 + lVar5 * 8) = pvVar1;
        if (pvVar1 != (void *)0x0) goto code_r0x001180cd;
        if (lVar5 != 0) {
          lVar8 = 0;
          do {
            free(*(void **)((long)__ptr_00 + lVar8 * 8));
            lVar8 = lVar8 + 1;
          } while (lVar5 != lVar8);
        }
        free(__ptr_00);
      }
      free(__ptr);
      msgfmt = "A memory request failed.";
      iVar7 = -0x15;
      error_code = -0x15;
      line = 0xa6;
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAAdjInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                  ,msgfmt);
  return iVar7;
code_r0x001180cd:
  *(undefined8 *)((long)pvVar1 + 8) = 0;
  lVar5 = lVar5 + 1;
  if (steps + 1 == lVar5) goto code_r0x001180dd;
  goto LAB_001180b9;
code_r0x001180dd:
  *(void **)((long)__ptr + 0x78) = __ptr_00;
  if (interp == 1) {
    pcVar2 = IDAAhermiteStorePnt;
    pcVar3 = IDAAhermiteGetY;
    pcVar4 = IDAAhermiteFree;
    pcVar6 = IDAAhermiteMalloc;
  }
  else {
    if (interp != 2) goto LAB_001181e3;
    pcVar2 = IDAApolynomialStorePnt;
    pcVar3 = IDAApolynomialGetY;
    pcVar4 = IDAApolynomialFree;
    pcVar6 = IDAApolynomialMalloc;
  }
  *(code **)((long)__ptr + 0xa0) = pcVar6;
  *(code **)((long)__ptr + 0xa8) = pcVar4;
  *(code **)((long)__ptr + 0x98) = pcVar3;
  *(code **)((long)__ptr + 0x90) = pcVar2;
LAB_001181e3:
  *(undefined4 *)((long)__ptr + 0xb0) = 0;
  *(undefined8 *)((long)__ptr + 0xb8) = 1;
  *(undefined4 *)((long)__ptr + 0xc0) = 0;
  *(undefined8 *)((long)__ptr + 0x30) = 0;
  *(undefined8 *)((long)__ptr + 0x40) = 0;
  *(undefined4 *)((long)__ptr + 0x38) = 0;
  *(undefined8 *)((long)__ptr + 0x10) = 1;
  *(undefined4 *)((long)__ptr + 0x48) = 1;
  *(undefined4 *)((long)__ptr + 0x20) = 0;
  *(undefined4 *)((long)ida_mem + 0x838) = 1;
  *(undefined4 *)((long)ida_mem + 0x848) = 1;
  return 0;
}

Assistant:

int IDAAdjInit(void* ida_mem, long int steps, int interp)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;

  /* Check arguments */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (steps <= 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_STEPS);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  if ((interp != IDA_HERMITE) && (interp != IDA_POLYNOMIAL))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_INTERP);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Allocate memory block for IDAadjMem. */
  IDAADJ_mem = (IDAadjMem)malloc(sizeof(struct IDAadjMemRec));
  if (IDAADJ_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGAM_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* Attach IDAS memory for forward runs */
  IDA_mem->ida_adj_mem = IDAADJ_mem;

  /* Initialization of check points. */
  IDAADJ_mem->ck_mem       = NULL;
  IDAADJ_mem->ia_nckpnts   = 0;
  IDAADJ_mem->ia_ckpntData = NULL;

  /* Initialization of interpolation data. */
  IDAADJ_mem->ia_interpType = interp;
  IDAADJ_mem->ia_nsteps     = steps;

  /* Last index used in IDAAfindIndex, initialize to invalid value */
  IDAADJ_mem->ia_ilast = -1;

  /* Allocate space for the array of Data Point structures. */
  if (IDAAdataMalloc(IDA_mem) == SUNFALSE)
  {
    free(IDAADJ_mem);
    IDAADJ_mem = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGAM_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* Attach functions for the appropriate interpolation module */
  switch (interp)
  {
  case IDA_HERMITE:
    IDAADJ_mem->ia_malloc   = IDAAhermiteMalloc;
    IDAADJ_mem->ia_free     = IDAAhermiteFree;
    IDAADJ_mem->ia_getY     = IDAAhermiteGetY;
    IDAADJ_mem->ia_storePnt = IDAAhermiteStorePnt;
    break;

  case IDA_POLYNOMIAL:

    IDAADJ_mem->ia_malloc   = IDAApolynomialMalloc;
    IDAADJ_mem->ia_free     = IDAApolynomialFree;
    IDAADJ_mem->ia_getY     = IDAApolynomialGetY;
    IDAADJ_mem->ia_storePnt = IDAApolynomialStorePnt;
    break;
  }

  /* The interpolation module has not been initialized yet */
  IDAADJ_mem->ia_mallocDone = SUNFALSE;

  /* By default we will store but not interpolate sensitivities
   *  - storeSensi will be set in IDASolveF to SUNFALSE if FSA is not enabled
   *    or if the user forced this through IDAAdjSetNoSensi
   *  - interpSensi will be set in IDASolveB to SUNTRUE if storeSensi is SUNTRUE
   *    and if at least one backward problem requires sensitivities
   *  - noInterp will be set in IDACalcICB to SUNTRUE before the call to
   *    IDACalcIC and SUNFALSE after.*/

  IDAADJ_mem->ia_storeSensi  = SUNTRUE;
  IDAADJ_mem->ia_interpSensi = SUNFALSE;
  IDAADJ_mem->ia_noInterp    = SUNFALSE;

  /* Initialize backward problems. */
  IDAADJ_mem->IDAB_mem    = NULL;
  IDAADJ_mem->ia_bckpbCrt = NULL;
  IDAADJ_mem->ia_nbckpbs  = 0;

  /* IDASolveF and IDASolveB not called yet. */
  IDAADJ_mem->ia_firstIDAFcall = SUNTRUE;
  IDAADJ_mem->ia_tstopIDAFcall = SUNFALSE;

  IDAADJ_mem->ia_firstIDABcall = SUNTRUE;

  IDAADJ_mem->ia_rootret = SUNFALSE;

  /* Adjoint module initialized and allocated. */
  IDA_mem->ida_adj           = SUNTRUE;
  IDA_mem->ida_adjMallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}